

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmShiftRg<(moira::Instr)69,(moira::Mode)0,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Dn)((op & 0xe00) >> 9));
  StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Dn)(op & 7));
  return;
}

Assistant:

void
Moira::dasmShiftRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = Dn ( _____________xxx(op) );
    auto src = Dn ( ____xxx_________(op) );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}